

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O3

void bio_write(opj_bio_t *bio,int v,int n)

{
  uchar *puVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  if (0 < n) {
    uVar2 = bio->buf;
    iVar3 = bio->ct;
    uVar4 = n + 1;
    do {
      uVar5 = uVar2;
      if (iVar3 == 0) {
        uVar5 = (uVar2 & 0xff) << 8;
        bio->buf = uVar5;
        iVar3 = ((uVar2 & 0xff) != 0xff) + 7;
        bio->ct = iVar3;
        puVar1 = bio->bp;
        if (puVar1 < bio->end) {
          bio->bp = puVar1 + 1;
          *puVar1 = (uchar)uVar2;
          iVar3 = bio->ct;
          uVar5 = bio->buf;
        }
      }
      iVar3 = iVar3 + -1;
      bio->ct = iVar3;
      uVar2 = (uint)(((uint)v >> (uVar4 - 2 & 0x1f) & 1) != 0) << ((byte)iVar3 & 0x1f) | uVar5;
      bio->buf = uVar2;
      uVar4 = uVar4 - 1;
    } while (1 < uVar4);
  }
  return;
}

Assistant:

void bio_write(opj_bio_t *bio, int v, int n) {
	int i;
	for (i = n - 1; i >= 0; i--) {
		bio_putbit(bio, (v >> i) & 1);
	}
}